

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLLinOp.cpp
# Opt level: O0

void amrex::MLLinOp::Initialize(void)

{
  ParmParse pp;
  int *in_stack_ffffffffffffff70;
  string *in_stack_ffffffffffffff78;
  ParmParse *in_stack_ffffffffffffff80;
  string local_78 [120];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"mg",(allocator *)&stack0xffffffffffffff87);
  ParmParse::ParmParse(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff87);
  ParmParse::queryAdd<int,_0>
            (in_stack_ffffffffffffff80,(char *)in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  ParmParse::queryAdd<int,_0>
            (in_stack_ffffffffffffff80,(char *)in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  ParmParse::queryAdd<int,_0>
            (in_stack_ffffffffffffff80,(char *)in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  ParmParse::queryAdd<int,_0>
            (in_stack_ffffffffffffff80,(char *)in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  ParmParse::queryAdd<int,_0>
            (in_stack_ffffffffffffff80,(char *)in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  ParmParse::queryAdd<int,_0>
            (in_stack_ffffffffffffff80,(char *)in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  ParmParse::queryAdd<int,_0>
            (in_stack_ffffffffffffff80,(char *)in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  ExecOnFinalize((PTR_TO_VOID_FUNC)0x12644e3);
  (anonymous_namespace)::initialized = 1;
  ParmParse::~ParmParse((ParmParse *)0x12644f6);
  return;
}

Assistant:

void MLLinOp::Initialize ()
{
    ParmParse pp("mg");
    pp.queryAdd("consolidation_threshold", consolidation_threshold);
    pp.queryAdd("consolidation_ratio", consolidation_ratio);
    pp.queryAdd("consolidation_strategy", consolidation_strategy);
    pp.queryAdd("verbose_linop", flag_verbose_linop);
    pp.queryAdd("comm_cache", flag_comm_cache);
    pp.queryAdd("mota", flag_use_mota);
    pp.queryAdd("remap_nbh_lb", remap_nbh_lb);

#ifdef BL_USE_MPI
    comm_cache = std::make_unique<CommCache>();
#endif
    amrex::ExecOnFinalize(MLLinOp::Finalize);
    initialized = true;
}